

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkPipelineLibraryCreateInfoKHR *create_info,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,bool in_pnext_chain,
               Value *out_value)

{
  bool bVar1;
  unsigned_long value;
  GenericStringRef<char> local_88;
  GenericStringRef<char> local_78;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_68;
  uint local_54;
  undefined1 local_50 [4];
  uint32_t i;
  Value libraries;
  Value library_info;
  Value *out_value_local;
  bool in_pnext_chain_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc_local;
  VkPipelineLibraryCreateInfoKHR *create_info_local;
  
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)((long)&libraries.data_ + 8),kObjectType);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_50,kArrayType);
  for (local_54 = 0; local_54 < create_info->libraryCount; local_54 = local_54 + 1) {
    value = api_object_cast<unsigned_long,VkPipeline_T*>(create_info->pLibraries[local_54]);
    uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ((Fossilize *)&local_68,value,alloc);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_50,&local_68,alloc);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_68);
  }
  rapidjson::GenericStringRef<char>::GenericStringRef<10u>(&local_78,(char (*) [10])"libraries");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)((long)&libraries.data_ + 8),&local_78,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_50,alloc);
  if (in_pnext_chain) {
    rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_88,(char (*) [6])"sType");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<VkStructureType>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)((long)&libraries.data_ + 8),&local_88,create_info->sType,alloc);
  }
  else {
    bVar1 = pnext_chain_add_json_value<VkPipelineLibraryCreateInfoKHR,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ((Value *)((long)&libraries.data_ + 8),create_info,alloc,
                       (DynamicStateInfo *)0x0);
    if (!bVar1) {
      create_info_local._7_1_ = false;
      goto LAB_001477b0;
    }
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  operator=(out_value,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)((long)&libraries.data_ + 8));
  create_info_local._7_1_ = true;
LAB_001477b0:
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_50);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)((long)&libraries.data_ + 8));
  return create_info_local._7_1_;
}

Assistant:

static bool json_value(const VkPipelineLibraryCreateInfoKHR &create_info, Allocator &alloc,
                       bool in_pnext_chain, Value *out_value)
{
	Value library_info(kObjectType);
	Value libraries(kArrayType);
	for (uint32_t i = 0; i < create_info.libraryCount; i++)
		libraries.PushBack(uint64_string(api_object_cast<uint64_t>(create_info.pLibraries[i]), alloc), alloc);
	library_info.AddMember("libraries", libraries, alloc);

	if (in_pnext_chain)
	{
		library_info.AddMember("sType", create_info.sType, alloc);
	}
	else
	{
		if (!pnext_chain_add_json_value(library_info, create_info, alloc, nullptr))
			return false;
	}

	*out_value = library_info;
	return true;
}